

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict type_qual(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  undefined1 local_38 [8];
  pos_t pos;
  node_t_conflict r;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x11e,(pos_t *)local_38,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    iVar2 = match(c2m_ctx,0x12e,(pos_t *)local_38,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      iVar2 = match(c2m_ctx,0x13b,(pos_t *)local_38,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        iVar2 = match(c2m_ctx,0x114,(pos_t *)local_38,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          if (ppVar1->record_level == 0) {
            syntax_error(c2m_ctx,"a type qualifier");
          }
          pos._8_8_ = &err_struct;
        }
        else {
          pos._8_8_ = new_pos_node(c2m_ctx,N_ATOMIC,_local_38);
        }
      }
      else {
        pos._8_8_ = new_pos_node(c2m_ctx,N_VOLATILE,_local_38);
      }
    }
    else {
      pos._8_8_ = new_pos_node(c2m_ctx,N_RESTRICT,_local_38);
    }
  }
  else {
    pos._8_8_ = new_pos_node(c2m_ctx,N_CONST,_local_38);
  }
  return (node_t_conflict)pos._8_8_;
}

Assistant:

D (type_qual) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;
  pos_t pos;

  if (MP (T_CONST, pos)) {
    r = new_pos_node (c2m_ctx, N_CONST, pos);
  } else if (MP (T_RESTRICT, pos)) {
    r = new_pos_node (c2m_ctx, N_RESTRICT, pos);
  } else if (MP (T_VOLATILE, pos)) {
    r = new_pos_node (c2m_ctx, N_VOLATILE, pos);
  } else if (MP (T_ATOMIC, pos)) {
    r = new_pos_node (c2m_ctx, N_ATOMIC, pos);
  } else {
    if (record_level == 0) syntax_error (c2m_ctx, "a type qualifier");
    r = err_node;
  }
  return r;
}